

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GraphicsAccessories.cpp
# Opt level: O2

String * __thiscall
Diligent::GetPipelineResourceFlagsString_abi_cxx11_
          (String *__return_storage_ptr__,Diligent *this,PIPELINE_RESOURCE_FLAGS Flags,
          bool GetFullName,char *DelimiterString)

{
  byte bVar1;
  byte bVar2;
  ulong uVar3;
  char *pcVar4;
  string msg;
  string local_50;
  
  if ((int)this == 0) {
    pcVar4 = "UNKNOWN";
    if (Flags != PIPELINE_RESOURCE_FLAG_NONE) {
      pcVar4 = "PIPELINE_RESOURCE_FLAG_NONE";
    }
    std::__cxx11::string::string((string *)__return_storage_ptr__,pcVar4,(allocator *)&local_50);
    return __return_storage_ptr__;
  }
  uVar3 = (ulong)this & 0xffffffff;
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
LAB_0060a4bc:
  do {
    bVar2 = (byte)uVar3;
    if (bVar2 == 0) {
      return __return_storage_ptr__;
    }
    if (__return_storage_ptr__->_M_string_length != 0) {
      std::__cxx11::string::append((char *)__return_storage_ptr__);
    }
    bVar1 = -bVar2 & bVar2;
    uVar3 = (ulong)(bVar2 ^ bVar1);
    switch(bVar1) {
    case 1:
      break;
    case 2:
      break;
    case 3:
    case 5:
    case 6:
    case 7:
      goto switchD_0060a4f7_caseD_3;
    case 4:
      break;
    case 8:
      break;
    default:
      if (bVar1 != 0x10) goto switchD_0060a4f7_caseD_3;
    }
    std::__cxx11::string::append((char *)__return_storage_ptr__);
  } while( true );
switchD_0060a4f7_caseD_3:
  FormatString<char[34]>(&local_50,(char (*) [34])"Unexpected pipeline resource flag");
  DebugAssertionFailed
            (local_50._M_dataplus._M_p,"GetPipelineResourceFlagsString",
             "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsAccessories/src/GraphicsAccessories.cpp"
             ,0x680);
  std::__cxx11::string::~string((string *)&local_50);
  goto LAB_0060a4bc;
}

Assistant:

String GetPipelineResourceFlagsString(PIPELINE_RESOURCE_FLAGS Flags, bool GetFullName /*= false*/, const char* DelimiterString /*= "|"*/)
{
    if (Flags == PIPELINE_RESOURCE_FLAG_NONE)
        return GetFullName ? "PIPELINE_RESOURCE_FLAG_NONE" : "UNKNOWN";
    String Str;
    while (Flags != PIPELINE_RESOURCE_FLAG_NONE)
    {
        if (!Str.empty())
            Str += DelimiterString;

        PIPELINE_RESOURCE_FLAGS Flag = ExtractLSB(Flags);

        static_assert(PIPELINE_RESOURCE_FLAG_LAST == (1u << 4), "Please update the switch below to handle the new pipeline resource flag.");
        switch (Flag)
        {
            case PIPELINE_RESOURCE_FLAG_NO_DYNAMIC_BUFFERS:
                Str.append(GetFullName ? "PIPELINE_RESOURCE_FLAG_NO_DYNAMIC_BUFFERS" : "NO_DYNAMIC_BUFFERS");
                break;

            case PIPELINE_RESOURCE_FLAG_COMBINED_SAMPLER:
                Str.append(GetFullName ? "PIPELINE_RESOURCE_FLAG_COMBINED_SAMPLER" : "COMBINED_SAMPLER");
                break;

            case PIPELINE_RESOURCE_FLAG_FORMATTED_BUFFER:
                Str.append(GetFullName ? "PIPELINE_RESOURCE_FLAG_FORMATTED_BUFFER" : "FORMATTED_BUFFER");
                break;

            case PIPELINE_RESOURCE_FLAG_RUNTIME_ARRAY:
                Str.append(GetFullName ? "PIPELINE_RESOURCE_FLAG_RUNTIME_ARRAY" : "RUNTIME_ARRAY");
                break;

            case PIPELINE_RESOURCE_FLAG_GENERAL_INPUT_ATTACHMENT:
                Str.append(GetFullName ? "PIPELINE_RESOURCE_FLAG_GENERAL_INPUT_ATTACHMENT" : "GENERAL_INPUT_ATTACHMENT");
                break;

            default:
                UNEXPECTED("Unexpected pipeline resource flag");
        }
    }
    return Str;
}